

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u8.cpp
# Opt level: O0

UChar32 ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  UConverter *pUVar4;
  UBool UVar5;
  short sVar6;
  int iVar7;
  int local_54;
  uint8_t t3;
  uint8_t t2_1;
  uint8_t t1_2;
  uint8_t t1_1;
  uint8_t t2;
  uint8_t t1;
  uint8_t b;
  uint16_t extraBytesToWrite;
  uint16_t countTrailBytes;
  int8_t i;
  UChar32 ch;
  uint8_t myByte;
  uint8_t *source;
  uint8_t *sourceInitial;
  UConverter *cnv;
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  pUVar4 = args->converter;
  source = (uint8_t *)args->source;
  if (source < args->sourceLimit) {
    _ch = source + 1;
    bVar1 = *source;
    if ((bVar1 & 0x80) == 0) {
      args->source = (char *)_ch;
      args_local._4_4_ = (uint)bVar1;
    }
    else {
      if ((byte)(bVar1 + 0x3e) < 0x33) {
        local_54 = (uint)(0xdf < bVar1) + (uint)(0xef < bVar1) + 1;
      }
      else {
        local_54 = 0;
      }
      sVar6 = (short)local_54;
      if (sVar6 == 0) {
        pUVar4->toUBytes[0] = bVar1;
        pUVar4->toULength = '\x01';
        *err = U_ILLEGAL_CHAR_FOUND;
        args->source = (char *)_ch;
        args_local._4_4_ = 0xffff;
      }
      else if (args->sourceLimit < _ch + local_54) {
        pUVar4->toUBytes[0] = bVar1;
        t2 = '\x01';
        *err = U_TRUNCATED_CHAR_FOUND;
        for (; _ch < args->sourceLimit; _ch = _ch + 1) {
          bVar2 = *_ch;
          UVar5 = icu_63::UTF8::isValidTrail
                            ((uint)bVar1,bVar2,(int)(char)t2,(uint)(ushort)(sVar6 + 1));
          if (UVar5 == '\0') {
            *err = U_ILLEGAL_CHAR_FOUND;
            break;
          }
          pUVar4->toUBytes[(char)t2] = bVar2;
          t2 = t2 + '\x01';
        }
        pUVar4->toULength = t2;
        args->source = (char *)_ch;
        args_local._4_4_ = 0xffff;
      }
      else {
        iVar7 = (uint)bVar1 * 0x40;
        if (sVar6 == 2) {
          bVar2 = *_ch;
          if (((int)" 000000000000\x1000"[(int)(bVar1 & 0xf)] & 1 << (sbyte)((int)(uint)bVar2 >> 5))
              != 0) {
            _ch = source + 2;
            bVar1 = source[2];
            if ((char)bVar1 < -0x40) {
              args->source = (char *)(source + 3);
              return (iVar7 + (uint)bVar2) * 0x40 + (uint)bVar1 + -0xe2080;
            }
          }
        }
        else if (sVar6 == 1) {
          bVar1 = *_ch;
          if ((char)bVar1 < -0x40) {
            args->source = (char *)(source + 2);
            return iVar7 + (uint)bVar1 + -0x3080;
          }
        }
        else {
          bVar2 = *_ch;
          if (((int)""[(int)(uint)bVar2 >> 4] & 1 << (bVar1 & 7)) != 0) {
            _ch = source + 2;
            bVar1 = source[2];
            if ((char)bVar1 < -0x40) {
              _ch = source + 3;
              bVar3 = source[3];
              if ((char)bVar3 < -0x40) {
                args->source = (char *)(source + 4);
                return ((iVar7 + (uint)bVar2) * 0x40 + (uint)bVar1) * 0x40 + (uint)bVar3 +
                       -0x3c82080;
              }
            }
          }
        }
        args->source = (char *)_ch;
        t2 = '\0';
        while (source < _ch) {
          pUVar4->toUBytes[(char)t2] = *source;
          t2 = t2 + '\x01';
          source = source + 1;
        }
        pUVar4->toULength = t2;
        *err = U_ILLEGAL_CHAR_FOUND;
        args_local._4_4_ = 0xffff;
      }
    }
  }
  else {
    *err = U_INDEX_OUTOFBOUNDS_ERROR;
    args_local._4_4_ = 0xffff;
  }
  return args_local._4_4_;
}

Assistant:

U_CDECL_BEGIN
static UChar32 U_CALLCONV ucnv_getNextUChar_UTF8(UConverterToUnicodeArgs *args,
                                               UErrorCode *err) {
    UConverter *cnv;
    const uint8_t *sourceInitial;
    const uint8_t *source;
    uint8_t myByte;
    UChar32 ch;
    int8_t i;

    /* UTF-8 only here, the framework handles CESU-8 to combine surrogate pairs */

    cnv = args->converter;
    sourceInitial = source = (const uint8_t *)args->source;
    if (source >= (const uint8_t *)args->sourceLimit)
    {
        /* no input */
        *err = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0xffff;
    }

    myByte = (uint8_t)*(source++);
    if (U8_IS_SINGLE(myByte))
    {
        args->source = (const char *)source;
        return (UChar32)myByte;
    }

    uint16_t countTrailBytes = U8_COUNT_TRAIL_BYTES(myByte);
    if (countTrailBytes == 0) {
        cnv->toUBytes[0] = myByte;
        cnv->toULength = 1;
        *err = U_ILLEGAL_CHAR_FOUND;
        args->source = (const char *)source;
        return 0xffff;
    }

    /*The byte sequence is longer than the buffer area passed*/
    if (((const char *)source + countTrailBytes) > args->sourceLimit)
    {
        /* check if all of the remaining bytes are trail bytes */
        uint16_t extraBytesToWrite = countTrailBytes + 1;
        cnv->toUBytes[0] = myByte;
        i = 1;
        *err = U_TRUNCATED_CHAR_FOUND;
        while(source < (const uint8_t *)args->sourceLimit) {
            uint8_t b = *source;
            if(icu::UTF8::isValidTrail(myByte, b, i, extraBytesToWrite)) {
                cnv->toUBytes[i++] = b;
                ++source;
            } else {
                /* error even before we run out of input */
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }
        cnv->toULength = i;
        args->source = (const char *)source;
        return 0xffff;
    }

    ch = myByte << 6;
    if(countTrailBytes == 2) {
        uint8_t t1 = *source, t2;
        if(U8_IS_VALID_LEAD3_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((ch + t1) << 6) + t2) - offsetsFromUTF8[3];
        }
    } else if(countTrailBytes == 1) {
        uint8_t t1 = *source;
        if(U8_IS_TRAIL(t1)) {
            args->source = (const char *)(source + 1);
            return (ch + t1) - offsetsFromUTF8[2];
        }
    } else {  // countTrailBytes == 3
        uint8_t t1 = *source, t2, t3;
        if(U8_IS_VALID_LEAD4_AND_T1(myByte, t1) && U8_IS_TRAIL(t2 = *++source) &&
                U8_IS_TRAIL(t3 = *++source)) {
            args->source = (const char *)(source + 1);
            return (((((ch + t1) << 6) + t2) << 6) + t3) - offsetsFromUTF8[4];
        }
    }
    args->source = (const char *)source;

    for(i = 0; sourceInitial < source; ++i) {
        cnv->toUBytes[i] = *sourceInitial++;
    }
    cnv->toULength = i;
    *err = U_ILLEGAL_CHAR_FOUND;
    return 0xffff;
}